

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muhash.h
# Opt level: O2

void MuHash3072::SerializationOps<DataStream,MuHash3072,ActionUnserialize>(long obj,undefined8 s)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Num3072::SerializationOps<DataStream,Num3072,ActionUnserialize>();
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    Num3072::SerializationOps<DataStream,Num3072,ActionUnserialize>(obj + 0x180,s);
    return;
  }
  __stack_chk_fail();
}

Assistant:

SERIALIZE_METHODS(MuHash3072, obj)
    {
        READWRITE(obj.m_numerator);
        READWRITE(obj.m_denominator);
    }